

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O3

void proto3_unittest::NestedTestAllTypes::SharedDtor(MessageLite *self)

{
  MessageLite *pMVar1;
  ulong uVar2;
  undefined8 extraout_RAX;
  
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
    uVar2 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    pMVar1 = (MessageLite *)self[1]._internal_metadata_.ptr_;
    if (pMVar1 != (MessageLite *)0x0) {
      SharedDtor(pMVar1);
    }
    operator_delete(pMVar1,0x28);
    pMVar1 = (MessageLite *)self[2]._vptr_MessageLite;
    if (pMVar1 != (MessageLite *)0x0) {
      TestAllTypes::SharedDtor(pMVar1);
    }
    operator_delete(pMVar1,0x2c8);
    return;
  }
  SharedDtor((NestedTestAllTypes *)&stack0xffffffffffffffe0);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

inline void NestedTestAllTypes::SharedDtor(MessageLite& self) {
  NestedTestAllTypes& this_ = static_cast<NestedTestAllTypes&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.child_;
  delete this_._impl_.payload_;
  this_._impl_.~Impl_();
}